

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O2

void __thiscall
CoreML::Specification::LayerNormalizationLayerParams::_internal_add_normalizedshape
          (LayerNormalizationLayerParams *this,int64_t value)

{
  int64_t local_8;
  
  local_8 = value;
  google::protobuf::RepeatedField<long>::Add(&this->normalizedshape_,&local_8);
  return;
}

Assistant:

inline void LayerNormalizationLayerParams::_internal_add_normalizedshape(int64_t value) {
  normalizedshape_.Add(value);
}